

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printPostIdxRegOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  uint uVar3;
  MCOperand *op;
  MCOperand *op_00;
  int64_t iVar4;
  char *s;
  MCOperand *MO2;
  MCOperand *MO1;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  op_00 = MCInst_getOperand(MI,OpNum + 1);
  iVar4 = MCOperand_getImm(op_00);
  s = "-";
  if (iVar4 != 0) {
    s = anon_var_dwarf_8761c + 0x11;
  }
  SStream_concat0(O,s);
  h = MI->csh;
  uVar3 = MCOperand_getReg(op);
  printRegName(h,O,uVar3);
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    uVar3 = MCOperand_getReg(op);
    *(uint *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar3;
    pcVar2 = MI->flat_insn->detail;
    (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
  }
  return;
}

Assistant:

static void printPostIdxRegOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);

	SStream_concat0(O, (MCOperand_getImm(MO2) ? "" : "-"));
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
		MI->flat_insn->detail->arm.op_count++;
	}
}